

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::make_l1_norm
          (quadratic_cost_type<long_double> *this,int n)

{
  longdouble *plVar1;
  quad *pqVar2;
  long lVar3;
  long lVar4;
  longdouble lVar5;
  long local_18;
  ushort uStack_10;
  
  plVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  lVar5 = (longdouble)0;
  for (lVar3 = 0; (ulong)(uint)n << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    lVar5 = ABS(*(longdouble *)((long)plVar1 + lVar3)) + lVar5;
  }
  lVar3 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n] << 5;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 0x20) {
    lVar5 = ABS(*(longdouble *)
                 ((long)&((this->quadratic_elements)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                         ._M_head_impl)->factor + lVar4)) + lVar5;
  }
  local_18 = SUB108(lVar5,0);
  uStack_10 = (ushort)((unkuint10)lVar5 >> 0x40);
  if ((ushort)((uStack_10 & 0x7fff) - 1) < 0x7ffe && local_18 < 0) {
    for (lVar4 = 0; (ulong)(uint)n << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      *(longdouble *)((long)plVar1 + lVar4) = *(longdouble *)((long)plVar1 + lVar4) / lVar5;
    }
    pqVar2 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
             _M_head_impl;
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 0x20) {
      *(longdouble *)((long)&pqVar2->factor + lVar4) =
           *(longdouble *)((long)&pqVar2->factor + lVar4) / lVar5;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }